

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O3

int LS_Scroll_Floor(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4
                   )

{
  double dx;
  double dy;
  double dy_00;
  double dx_00;
  
  dx_00 = (double)arg1 * 0.03125;
  dy = (double)arg2 * 0.03125;
  if ((arg3 & 0xfffffffdU) == 0) {
    dx = -dx_00;
    dy_00 = dy;
  }
  else {
    dx = 0.0;
    dy_00 = 0.0;
  }
  SetScroller(arg0,sc_floor,dx,dy_00);
  if (arg3 < 1) {
    dx_00 = 0.0;
    dy = 0.0;
  }
  SetScroller(arg0,sc_carry,dx_00,dy);
  return 1;
}

Assistant:

FUNC(LS_Scroll_Floor)
// Scroll_Floor (tag, x-move, y-move, s/c)
{
	double dx = arg1 / 32.;
	double dy = arg2 / 32.;

	if (arg3 == 0 || arg3 == 2)
	{
		SetScroller (arg0, EScroll::sc_floor, -dx, dy);
	}
	else
	{
		SetScroller (arg0, EScroll::sc_floor, 0, 0);
	}
	if (arg3 > 0)
	{
		SetScroller (arg0, EScroll::sc_carry, dx, dy);
	}
	else
	{
		SetScroller (arg0, EScroll::sc_carry, 0, 0);
	}
	return true;
}